

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

size_t container_get_frozen_size(container_t *c,uint8_t typecode)

{
  uint32_t uVar1;
  uint8_t in_SIL;
  container_t *in_RDI;
  undefined8 local_8;
  
  if (in_SIL == '\x01') {
    local_8 = 0x2000;
  }
  else if (in_SIL == '\x02') {
    uVar1 = container_get_element_count(in_RDI,'\x02');
    local_8 = (ulong)uVar1 << 1;
  }
  else {
    uVar1 = container_get_element_count(in_RDI,in_SIL);
    local_8 = (ulong)uVar1 << 2;
  }
  return local_8;
}

Assistant:

static inline size_t container_get_frozen_size(const container_t *c,
                                               uint8_t typecode) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            return BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
        }
        case ARRAY_CONTAINER_TYPE: {
            return container_get_element_count(c, typecode) * sizeof(uint16_t);
        }
        case RUN_CONTAINER_TYPE: {
            return container_get_element_count(c, typecode) * sizeof(rle16_t);
        }
        default: {
            assert(false);
            roaring_unreachable;
            return 0;
        }
    }
}